

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O3

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  _Map_pointer pppVar1;
  unique_lock<std::mutex> m;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pppVar1 = (this->queue).c.
            super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (this->max_size <=
      ((long)(this->queue).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->queue).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)(this->queue).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->queue).c.
             super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      ((((ulong)((long)pppVar1 -
                (long)(this->queue).c.
                      super__Deque_base<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppVar1 == (_Map_pointer)0x0)) * 0x20) {
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::push_and_wait(std::packaged_task<void()>&&)::_lambda()_1_>
              (&this->cond_var_push,&local_28,(anon_class_8_1_8991fb9c)this);
  }
  std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
  emplace_back<std::packaged_task<void()>>
            ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)this,
             item);
  std::unique_lock<std::mutex>::unlock(&local_28);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void NotLockFreeQueue<T>::push_and_wait(T&& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.size() >= max_size) {
        cond_var_push.wait(m, [this]{return queue.size() < max_size;});
    }
    queue.push(std::move(item));
    m.unlock();
    cond_var_pop.notify_one();
}